

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

RayDifferential * __thiscall
pbrt::Transform::operator()(Transform *this,RayDifferential *r,Float *tMax)

{
  undefined8 uVar1;
  Transform *in_RCX;
  long in_RDX;
  MediumHandle *in_RSI;
  RayDifferential *in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  Vector3<float> VVar8;
  Point3<float> *in_stack_00000078;
  Transform *in_stack_00000080;
  Ray tr;
  RayDifferential *ret;
  Ray *pRVar9;
  Ray *in_stack_fffffffffffffed0;
  MediumHandle *this_00;
  RayDifferential *d;
  Point3f *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Float *in_stack_ffffffffffffffa8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  in_stack_ffffffffffffffb0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  in_stack_ffffffffffffffb8;
  Vector3<float> *in_stack_ffffffffffffffd8;
  undefined1 auVar6 [56];
  
  pRVar9 = (Ray *)&stack0xffffffffffffff90;
  d = in_RDI;
  Ray::Ray(in_stack_fffffffffffffed0,pRVar9);
  this_00 = (MediumHandle *)&stack0xffffffffffffffb8;
  operator()((Transform *)in_stack_ffffffffffffffb8.bits,(Ray *)in_stack_ffffffffffffffb0.bits,
             in_stack_ffffffffffffffa8);
  MediumHandle::MediumHandle(this_00,(MediumHandle *)pRVar9);
  auVar6 = (undefined1  [56])0x0;
  RayDifferential::RayDifferential
            ((RayDifferential *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,(Vector3f *)d,(Float)((ulong)in_RDI >> 0x20),in_RSI);
  in_RDI->hasDifferentials = (bool)(*(byte *)(in_RDX + 0x28) & 1);
  PVar7 = operator()(in_stack_00000080,in_stack_00000078);
  auVar2._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar2._0_16_);
  (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z
  ;
  (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (in_RDI->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  PVar7 = operator()(in_stack_00000080,in_stack_00000078);
  auVar3._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z
  ;
  (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (in_RDI->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar8 = operator()(in_RCX,in_stack_ffffffffffffffd8);
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  VVar8 = operator()(in_RCX,in_stack_ffffffffffffffd8);
  auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  return d;
}

Assistant:

inline RayDifferential Transform::operator()(const RayDifferential &r,
                                             Float *tMax) const {
    Ray tr = (*this)(Ray(r), tMax);
    RayDifferential ret(tr.o, tr.d, tr.time, tr.medium);
    ret.hasDifferentials = r.hasDifferentials;
    ret.rxOrigin = (*this)(r.rxOrigin);
    ret.ryOrigin = (*this)(r.ryOrigin);
    ret.rxDirection = (*this)(r.rxDirection);
    ret.ryDirection = (*this)(r.ryDirection);
    return ret;
}